

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,unsigned_long,std::vector<double,std::allocator<double>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind
                 ,unsigned_long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  size_t sVar10;
  ulong *puVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble lVar14;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar15;
  longdouble lVar16;
  longdouble local_10c;
  longdouble local_f8;
  longdouble local_d4;
  longdouble local_c8;
  longdouble local_bc;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  
  uVar9 = Xc_indptr[col_num];
  uVar3 = Xc_indptr[col_num + 1];
  if (uVar9 != uVar3) {
    local_10c = (longdouble)0;
    for (sVar10 = st; sVar10 <= end; sVar10 = sVar10 + 1) {
      local_10c = local_10c +
                  (longdouble)
                  (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[ix_arr[sVar10]];
    }
    local_bc = (longdouble)0;
    if (local_bc < local_10c) {
      puVar1 = Xc_ind + uVar3;
      uVar4 = puVar1[-1];
      puVar11 = ix_arr + end + 1;
      puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (ix_arr + st,puVar11,Xc_ind + uVar9);
      if (missing_action == Fail) {
        local_f8 = (longdouble)0;
        local_d4 = local_f8;
        local_c8 = local_f8;
        local_bc = local_f8;
        do {
          puVar2 = Xc_ind + uVar9;
          while( true ) {
            if (((puVar7 == puVar11) || (uVar9 == uVar3)) || (uVar5 = *puVar7, uVar4 < uVar5))
            goto LAB_002cb3ce;
            if (*puVar2 == uVar5) break;
            lVar12 = in_ST1;
            lVar13 = in_ST2;
            lVar14 = in_ST3;
            if (*puVar2 <= uVar5) goto LAB_002cb391;
            puVar7 = std::
                     __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar7 + 1,puVar11,puVar2);
          }
          lVar12 = in_ST4;
          lVar13 = in_ST4;
          lVar14 = in_ST4;
          fmal();
          fmal();
          lVar15 = lVar14;
          fmal();
          fmal();
          local_f8 = in_ST0;
          local_d4 = in_ST1;
          local_c8 = in_ST2;
          local_bc = in_ST3;
          if ((puVar7 == ix_arr + end) || (uVar9 == uVar3 - 1)) goto LAB_002cb3ce;
          puVar7 = puVar7 + 1;
          in_ST0 = in_ST4;
          in_ST4 = lVar15;
LAB_002cb391:
          in_ST3 = lVar14;
          in_ST2 = lVar13;
          in_ST1 = lVar12;
          puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar2 + 1,puVar1,puVar7);
          uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
        } while( true );
      }
      local_f8 = (longdouble)0;
      local_d4 = local_f8;
      local_c8 = local_f8;
      do {
        puVar2 = Xc_ind + uVar9;
LAB_002cb050:
        if (((puVar7 == puVar11) || (uVar9 == uVar3)) || (uVar5 = *puVar7, uVar4 < uVar5)) {
LAB_002cb218:
          if (local_10c <= (longdouble)0) {
            return -INFINITY;
          }
LAB_002cb3ce:
          if (local_10c <= (longdouble)1) {
            return -INFINITY;
          }
          if ((local_d4 == (longdouble)0) && (!NAN(local_d4) && !NAN((longdouble)0))) {
            return -INFINITY;
          }
          if ((local_d4 == local_f8 * local_f8) && (!NAN(local_d4) && !NAN(local_f8 * local_f8))) {
            return -INFINITY;
          }
          lVar12 = local_f8 / local_10c;
          lVar13 = lVar12 * lVar12;
          lVar14 = local_d4 / local_10c - lVar13;
          if (NAN(lVar14)) {
            return -INFINITY;
          }
          if ((lVar14 <= (longdouble)2.220446e-16) &&
             (bVar6 = check_more_than_two_unique_values<float,unsigned_long>
                                (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar6))
          {
            return -INFINITY;
          }
          if (lVar14 <= (longdouble)0) {
            return 0.0;
          }
          lVar12 = (lVar13 * lVar12 * lVar12 * local_10c +
                   local_f8 * (longdouble)-4.0 * lVar13 * lVar12 +
                   local_d4 * (longdouble)6.0 * lVar13 +
                   local_bc + local_c8 * (longdouble)-4.0 * lVar12) / (lVar14 * lVar14 * local_10c);
          local_68 = SUB108(lVar12,0);
          uStack_60 = (ushort)((unkuint10)lVar12 >> 0x40);
          if (((unkuint10)lVar12 & 0x7fff) == 0 ||
              (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
            if ((double)lVar12 <= 0.0) {
              return 0.0;
            }
            return (double)lVar12;
          }
          return -INFINITY;
        }
        if (*puVar2 != uVar5) {
          if (*puVar2 <= uVar5) goto LAB_002cb1e7;
          puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar7 + 1,puVar11,puVar2);
          goto LAB_002cb050;
        }
        lVar12 = (longdouble)Xc[uVar9];
        local_58 = SUB108(lVar12,0);
        uStack_50 = (ushort)((unkuint10)lVar12 >> 0x40);
        if ((NAN(Xc[uVar9])) || ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000)) {
          local_10c = local_10c -
                      (longdouble)
                      (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar5];
          lVar12 = in_ST0;
          lVar13 = in_ST1;
          lVar14 = in_ST2;
          lVar15 = in_ST3;
        }
        else {
          lVar13 = in_ST4;
          lVar14 = in_ST4;
          lVar15 = in_ST4;
          fmal();
          fmal();
          lVar16 = lVar15;
          fmal();
          fmal();
          lVar12 = in_ST4;
          in_ST4 = lVar16;
          local_f8 = in_ST0;
          local_d4 = in_ST1;
          local_c8 = in_ST2;
          local_bc = in_ST3;
        }
        in_ST3 = lVar15;
        in_ST2 = lVar14;
        in_ST1 = lVar13;
        in_ST0 = lVar12;
        if ((puVar7 == ix_arr + end) || (uVar9 == uVar3 - 1)) goto LAB_002cb218;
        puVar7 = puVar7 + 1;
LAB_002cb1e7:
        puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar2 + 1,puVar1,puVar7);
        uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
      } while( true );
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}